

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void shopper_financial_report(void)

{
  short sVar1;
  monst *pmVar2;
  long lVar3;
  monst *pmVar4;
  char *pcVar5;
  char *pcVar6;
  byte rmno;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  bool bVar11;
  bool bVar12;
  
  uVar8 = *(uint *)&level->locations[u.ux][u.uy].field_0x6;
  uVar9 = uVar8 >> 0x10 & 0x3f;
  rmno = 0;
  if ((uVar8 >> 0x16 & 1) == 0 && 2 < uVar9) {
    rmno = 0;
    if ('\x11' < level->rooms[uVar9 - 3].rtype) {
      rmno = (byte)(uVar8 >> 0x10) & 0x3f;
    }
  }
  pmVar2 = shop_keeper(level,rmno);
  if (pmVar2 == (monst *)0x0) {
    pmVar2 = (monst *)0x0;
  }
  else if (pmVar2[0x1b].mappearance == 0) {
    lVar3 = (long)*(int *)&pmVar2[0x1b].field_0x60;
    iVar7 = (int)*(short *)((long)&pmVar2[0x1b].misc_worn_check + 2);
    if (0 < iVar7) {
      uVar8 = iVar7 + 1;
      piVar10 = (int *)(*(long *)&pmVar2[0x1b].mnum + 0xc);
      do {
        lVar3 = lVar3 + (long)*piVar10 * (long)piVar10[-1];
        uVar8 = uVar8 - 1;
        piVar10 = piVar10 + 4;
      } while (1 < uVar8);
    }
    if (lVar3 == 0) {
      pmVar2 = (monst *)0x0;
      pline("You have no credit or debt in here.");
    }
  }
  bVar11 = pmVar2 == (monst *)0x0;
  do {
    for (pmVar4 = next_shkp(level->monlist,'\0'); pmVar4 != (monst *)0x0;
        pmVar4 = next_shkp(pmVar4->nmon,'\0')) {
      if (bVar11 == (pmVar4 != pmVar2)) {
        lVar3 = (long)(int)pmVar4[0x1b].mappearance;
        if (lVar3 == 0) {
          if (pmVar4 == pmVar2) {
            pline("You have no credit in here.");
          }
        }
        else {
          pcVar5 = currency(lVar3);
          pcVar6 = s_suffix((char *)((long)&pmVar4[0x1c].minvent + 5));
          pline("You have %ld %s credit at %s %s.",lVar3,pcVar5,pcVar6,
                (&PTR_false_rumor_start_00312460)[(long)(short)pmVar4[0x1b].misc_worn_check * 0x18])
          ;
        }
        lVar3 = (long)*(int *)&pmVar4[0x1b].field_0x60;
        sVar1 = *(short *)((long)&pmVar4[0x1b].misc_worn_check + 2);
        if (0 < sVar1) {
          uVar8 = (int)sVar1 + 1;
          piVar10 = (int *)(*(long *)&pmVar4[0x1b].mnum + 0xc);
          do {
            lVar3 = lVar3 + (long)*piVar10 * (long)piVar10[-1];
            uVar8 = uVar8 - 1;
            piVar10 = piVar10 + 4;
          } while (1 < uVar8);
        }
        if (lVar3 == 0) {
          if (pmVar4 == pmVar2) {
            pline("You don\'t owe any money here.");
          }
        }
        else {
          pcVar5 = currency(lVar3);
          pline("You owe %s %ld %s.",(undefined1 *)((long)&pmVar4[0x1c].minvent + 5),lVar3,pcVar5);
        }
      }
    }
    bVar12 = bVar11 == false;
    bVar11 = true;
  } while (bVar12);
  return;
}

Assistant:

void shopper_financial_report(void)
{
	struct monst *shkp, *this_shkp = shop_keeper(level, inside_shop(level, u.ux, u.uy));
	struct eshk *eshkp;
	long amt;
	int pass;

	if (this_shkp &&
	    !(ESHK(this_shkp)->credit || shop_debt(ESHK(this_shkp)))) {
	    pline("You have no credit or debt in here.");
	    this_shkp = 0;	/* skip first pass */
	}

	/* pass 0: report for the shop we're currently in, if any;
	   pass 1: report for all other shops on this level. */
	for (pass = this_shkp ? 0 : 1; pass <= 1; pass++)
	    for (shkp = next_shkp(level->monlist, FALSE);
		    shkp; shkp = next_shkp(shkp->nmon, FALSE)) {
		if ((shkp != this_shkp) ^ pass) continue;
		eshkp = ESHK(shkp);
		if ((amt = eshkp->credit) != 0)
		    pline("You have %ld %s credit at %s %s.",
			amt, currency(amt), s_suffix(shkname(shkp)),
			shtypes[eshkp->shoptype - SHOPBASE].name);
		else if (shkp == this_shkp)
		    pline("You have no credit in here.");
		if ((amt = shop_debt(eshkp)) != 0)
		    pline("You owe %s %ld %s.",
			shkname(shkp), amt, currency(amt));
		else if (shkp == this_shkp)
		    pline("You don't owe any money here.");
	    }
}